

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

String * Corrade::Utility::Path::join
                   (String *__return_storage_ptr__,StringView path,StringView filename)

{
  initializer_list<Corrade::Containers::BasicStringView<const_char>_> view;
  StringView view_00;
  bool bVar1;
  BasicStringView<const_char> local_b8;
  char *local_a8;
  char *local_a0;
  iterator local_98;
  undefined8 local_90;
  StringIterable local_88;
  StringView local_60;
  BasicStringView<const_char> local_50;
  char *local_40;
  char *local_38;
  undefined1 local_30 [8];
  StringView filename_local;
  StringView path_local;
  
  filename_local._data = (char *)filename._sizePlusFlags;
  local_30 = (undefined1  [8])filename._data;
  path_local._data = (char *)path._sizePlusFlags;
  filename_local._sizePlusFlags = (size_t)path._data;
  bVar1 = Containers::BasicStringView::operator_cast_to_bool
                    ((BasicStringView *)&filename_local._sizePlusFlags);
  if ((!bVar1) ||
     (bVar1 = Containers::BasicStringView<const_char>::hasPrefix
                        ((BasicStringView<const_char> *)local_30,'/'), bVar1)) {
    local_40 = (char *)local_30;
    local_38 = filename_local._data;
    view_00._sizePlusFlags = (size_t)filename_local._data;
    view_00._data = (char *)local_30;
    Containers::String::String(__return_storage_ptr__,view_00);
  }
  else {
    bVar1 = Containers::BasicStringView<const_char>::hasSuffix
                      ((BasicStringView<const_char> *)&filename_local._sizePlusFlags,'/');
    if (bVar1) {
      local_50 = Containers::BasicStringView<const_char>::exceptSuffix
                           ((BasicStringView<const_char> *)&filename_local._sizePlusFlags,1);
      filename_local._sizePlusFlags = (size_t)local_50._data;
      path_local._data = (char *)local_50._sizePlusFlags;
    }
    local_60 = Containers::Literals::StringLiterals::operator____s("/",1);
    local_b8._data = (char *)filename_local._sizePlusFlags;
    local_b8._sizePlusFlags = (size_t)path_local._data;
    local_a8 = (char *)local_30;
    local_a0 = filename_local._data;
    local_98 = &local_b8;
    local_90 = 2;
    view._M_len = 2;
    view._M_array = local_98;
    Containers::StringIterable::StringIterable(&local_88,view);
    Containers::BasicStringView<const_char>::join(__return_storage_ptr__,&local_60,&local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

Containers::String join(Containers::StringView path, const Containers::StringView filename) {
    if(
        /* Empty path */
        !path ||

        /* Absolute filename */
        filename.hasPrefix('/')

        #ifdef CORRADE_TARGET_WINDOWS
        /* Absolute filename on Windows */
        || (filename.size() > 2 && filename[1] == ':' && filename[2] == '/')
        #endif
    )
        return filename;

    /* Join with a slash in between. If it's already there, slice it away first
       so we have uniform handling. */
    if(path.hasSuffix('/')) path = path.exceptSuffix(1);
    return "/"_s.join({path, filename});
}